

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_loadstring(lua_State *L)

{
  int iVar1;
  char *def;
  lua_State *in_RDI;
  lua_State *unaff_retaddr;
  char *chunkname;
  char *s;
  size_t l;
  size_t *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  def = luaL_checklstring((lua_State *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0)
                          ,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),in_stack_ffffffffffffffe0
                         );
  luaL_optlstring(in_RDI,in_stack_fffffffffffffff4,def,in_stack_ffffffffffffffe0);
  luaL_loadbuffer(unaff_retaddr,(char *)in_RDI,
                  CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),def);
  iVar1 = load_aux(in_RDI,0);
  return iVar1;
}

Assistant:

static int luaB_loadstring(lua_State*L){
size_t l;
const char*s=luaL_checklstring(L,1,&l);
const char*chunkname=luaL_optstring(L,2,s);
return load_aux(L,luaL_loadbuffer(L,s,l,chunkname));
}